

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReshapeStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshapestatic(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReshapeStaticLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reshapestatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reshapestatic(this);
    this_00 = (ReshapeStaticLayerParams *)operator_new(0x28);
    ReshapeStaticLayerParams::ReshapeStaticLayerParams(this_00);
    (this->layer_).reshapestatic_ = this_00;
  }
  return (ReshapeStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeStaticLayerParams* NeuralNetworkLayer::mutable_reshapestatic() {
  if (!has_reshapestatic()) {
    clear_layer();
    set_has_reshapestatic();
    layer_.reshapestatic_ = new ::CoreML::Specification::ReshapeStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshapeStatic)
  return layer_.reshapestatic_;
}